

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QDockAreaLayoutInfo * __thiscall
QMainWindowLayout::dockInfo(QMainWindowLayout *this,QWidget *widget)

{
  long lVar1;
  QDockAreaLayoutInfo *pQVar2;
  QLayout *pQVar3;
  QList<QDockWidgetGroupWindow_*> *__range1;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QList<QDockWidgetGroupWindow_*> list;
  QArrayData *local_48;
  long lStack_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QDockAreaLayout::info((QDockAreaLayout *)(this + 0x1a0),widget);
  if (pQVar2 == (QDockAreaLayoutInfo *)0x0) {
    local_48 = (QArrayData *)0x0;
    lStack_40 = 0;
    local_38 = 0;
    pQVar2 = (QDockAreaLayoutInfo *)0x0;
    qt_qFindChildren_helper
              (*(undefined8 *)(*(long *)(this + 8) + 0x10),0,0,
               &QDockWidgetGroupWindow::staticMetaObject,&local_48,0);
    lVar1 = lStack_40;
    if (local_38 != 0) {
      lVar5 = local_38 << 3;
      lVar4 = 0;
      do {
        pQVar3 = QWidget::layout(*(QWidget **)(lVar1 + lVar4));
        pQVar2 = QDockAreaLayoutInfo::info
                           ((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem,widget);
        if (pQVar2 != (QDockAreaLayoutInfo *)0x0) goto LAB_0043b893;
        lVar4 = lVar4 + 8;
      } while (lVar5 != lVar4);
      pQVar2 = (QDockAreaLayoutInfo *)0x0;
    }
LAB_0043b893:
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutInfo *QMainWindowLayout::dockInfo(QWidget *widget)
{
    QDockAreaLayoutInfo *info = layoutState.dockAreaLayout.info(widget);
    if (info)
        return info;
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        info = dwgw->layoutInfo()->info(widget);
        if (info)
            return info;
    }
    return nullptr;
}